

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_0::Table_ConstructFromInitList_Test::TestBody
          (Table_ConstructFromInitList_Test *this)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  StringTable t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  local_158;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  local_128.first._M_dataplus._M_p = (pointer)&local_128.first.field_2;
  local_128.first._M_string_length = 0;
  local_128.first.field_2._M_local_buf[0] = '\0';
  local_128.second._M_dataplus._M_p = (pointer)&local_128.second.field_2;
  local_128.second._M_string_length = 0;
  local_128.second.field_2._M_local_buf[0] = '\0';
  local_e8 = local_d8;
  local_e0 = 0;
  local_d8[0] = 0;
  local_c8 = local_b8;
  local_c0 = 0;
  local_b8[0] = 0;
  local_a8 = local_98;
  local_a0 = 0;
  local_98[0] = 0;
  local_88 = local_78;
  local_80 = 0;
  local_78[0] = 0;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_198._M_string_length = 0;
  local_198.field_2._M_local_buf[0] = '\0';
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_68,&local_178,&local_198);
  local_158.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
        )(_Head_base<0UL,_unsigned_long,_false>)0x0;
  local_158.ctrl_ = (ctrl_t *)0x0;
  local_158.slots_ = (slot_type *)0x0;
  local_158.size_ = 0;
  local_158.capacity_ = 0;
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::
  insert<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_0>
            (&local_158,&local_128,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&stack0xffffffffffffffd8);
  lVar1 = -0x100;
  paVar2 = &local_68.second.field_2;
  do {
    if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar2->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar2->_M_allocated_capacity)[-2],paVar2->_M_allocated_capacity + 1
                     );
    }
    if (&paVar2->_M_allocated_capacity + -4 != (size_type *)(&paVar2->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar2->_M_allocated_capacity)[-6],
                      (&paVar2->_M_allocated_capacity)[-4] + 1);
    }
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar2->_M_allocated_capacity + -8);
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,
                    CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                             local_198.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::destroy_slots(&local_158);
  return;
}

Assistant:

TEST(Group, MatchEmptyOrDeleted) {
  PHMAP_IF_CONSTEXPR (Group::kWidth == 16) {
    ctrl_t group[] = {kEmpty, 1, kDeleted, 3, kEmpty, 5, kSentinel, 7,
                      7,      5, 3,        1, 1,      1, 1,         1};
    EXPECT_THAT(Group{group}.MatchEmptyOrDeleted(), ElementsAre(0, 2, 4));
  } else PHMAP_IF_CONSTEXPR (Group::kWidth == 8) {
    ctrl_t group[] = {kEmpty, 1, 2, kDeleted, 2, 1, kSentinel, 1};
    EXPECT_THAT(Group{group}.MatchEmptyOrDeleted(), ElementsAre(0, 3));
  } else {
    FAIL() << "No test coverage for Group::kWidth==" << Group::kWidth;
  }